

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string *
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,xpath_node *na,xpath_allocator *alloc)

{
  char *pcVar1;
  xml_node_struct *pxVar2;
  uint uVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  xpath_string local_48;
  
  pxVar5 = (xml_node_struct *)(na->_attribute)._attr;
  pcVar1 = "";
  if (pxVar5 == (xml_node_struct *)0x0) {
    pxVar5 = (na->_node)._root;
    if (pxVar5 == (xml_node_struct *)0x0) goto LAB_00128750;
    uVar3 = (uint)pxVar5->header & 0xf;
    if (3 < uVar3 - 3) {
      if (uVar3 - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        local_48._buffer = pxVar5->value;
        if (local_48._buffer == (char *)0x0) {
          local_48._buffer = "";
        }
        if (*local_48._buffer != '\0') {
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
        }
        pxVar4 = pxVar5->first_child;
        while( true ) {
          pxVar2 = pxVar4;
          if (pxVar2 == (xml_node_struct *)0x0) {
            return __return_storage_ptr__;
          }
          if (pxVar2 == pxVar5) break;
          if ((ulong)((uint)pxVar2->header & 0xf) - 3 < 2) {
            local_48._buffer = pxVar2->value;
            if (local_48._buffer == (char *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          pxVar4 = pxVar2->first_child;
          if ((pxVar2->first_child == (xml_node_struct *)0x0) &&
             (pxVar4 = pxVar2->next_sibling, pxVar2->next_sibling == (xml_node_struct *)0x0)) {
            while( true ) {
              do {
                pxVar4 = pxVar2;
                pxVar2 = (xml_node_struct *)0x0;
              } while (pxVar4 == (xml_node_struct *)0x0);
              if ((pxVar4 == pxVar5) || (pxVar4->next_sibling != (xml_node_struct *)0x0)) break;
              pxVar2 = pxVar4->parent;
            }
            if (pxVar4 != pxVar5) {
              pxVar4 = pxVar4->next_sibling;
            }
          }
        }
        return __return_storage_ptr__;
      }
      goto LAB_00128750;
    }
  }
  if (pxVar5->value != (char *)0x0) {
    pcVar1 = pxVar5->value;
  }
LAB_00128750:
  __return_storage_ptr__->_buffer = pcVar1;
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}